

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Vec_Wec_t * Gia_ManCreateCoSupps(Gia_Man_t *p,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  abctime aVar7;
  Vec_Wec_t *p_00;
  Vec_Wec_t *p_01;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *p_02;
  ulong uVar11;
  abctime aVar12;
  int *piVar13;
  int iVar14;
  int i;
  int *piVar15;
  int *piVar16;
  
  aVar7 = Abc_Clock();
  p_00 = Vec_WecStart(p->vCos->nSize);
  p_01 = Vec_WecStart(p->nObjs);
  for (iVar14 = 0; iVar14 < p->vCis->nSize; iVar14 = iVar14 + 1) {
    pGVar8 = Gia_ManCi(p,iVar14);
    iVar4 = Gia_ObjId(p,pGVar8);
    if (iVar4 == 0) break;
    pVVar9 = Vec_WecEntry(p_01,iVar4);
    Vec_IntPush(pVVar9,iVar14);
  }
  iVar14 = 0;
  do {
    if ((p->nObjs <= iVar14) || (pGVar8 = Gia_ManObj(p,iVar14), pGVar8 == (Gia_Obj_t *)0x0)) {
      iVar14 = 0;
      while ((iVar14 < p->vCos->nSize && (pGVar8 = Gia_ManCo(p,iVar14), pGVar8 != (Gia_Obj_t *)0x0))
            ) {
        pVVar9 = Vec_WecEntry(p_00,iVar14);
        iVar4 = Gia_ObjFaninId0p(p,pGVar8);
        pVVar10 = Vec_WecEntry(p_01,iVar4);
        for (iVar4 = 0; iVar4 < pVVar10->nSize; iVar4 = iVar4 + 1) {
          iVar6 = Vec_IntEntry(pVVar10,iVar4);
          Vec_IntPush(pVVar9,iVar6);
        }
        iVar14 = iVar14 + 1;
      }
      Vec_WecFree(p_01);
      if (fVerbose != 0) {
        aVar12 = Abc_Clock();
        Abc_Print(1,"%s =","Support computation");
        Abc_Print(1,"%9.2f sec\n",(double)(aVar12 - aVar7) / 1000000.0);
      }
      return p_00;
    }
    uVar5 = (uint)*(undefined8 *)pGVar8;
    if ((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5) {
      pVVar9 = Vec_WecEntry(p_01,iVar14 - (uVar5 & 0x1fffffff));
      pVVar10 = Vec_WecEntry(p_01,iVar14 - (*(uint *)&pGVar8->field_0x4 & 0x1fffffff));
      p_02 = Vec_WecEntry(p_01,iVar14);
      Vec_IntGrow(p_02,pVVar10->nSize + pVVar9->nSize);
      piVar3 = p_02->pArray;
      piVar15 = pVVar9->pArray;
      piVar13 = pVVar10->pArray;
      piVar1 = piVar15 + pVVar9->nSize;
      piVar2 = piVar13 + pVVar10->nSize;
      uVar11 = 0;
      piVar16 = piVar3;
      while ((piVar15 < piVar1 && (piVar13 < piVar2))) {
        iVar4 = *piVar15;
        iVar6 = *piVar13;
        if (iVar4 == iVar6) {
          piVar15 = piVar15 + 1;
          *piVar16 = iVar4;
          piVar13 = piVar13 + 1;
        }
        else if (iVar4 < iVar6) {
          piVar15 = piVar15 + 1;
          *piVar16 = iVar4;
        }
        else {
          piVar13 = piVar13 + 1;
          *piVar16 = iVar6;
        }
        piVar16 = piVar16 + 1;
        uVar11 = uVar11 + 4;
      }
      for (; piVar15 < piVar1; piVar15 = piVar15 + 1) {
        *piVar16 = *piVar15;
        piVar16 = piVar16 + 1;
        uVar11 = uVar11 + 4;
      }
      for (; piVar13 < piVar2; piVar13 = piVar13 + 1) {
        *(int *)((long)piVar3 + uVar11) = *piVar13;
        uVar11 = uVar11 + 4;
      }
      iVar4 = (int)(uVar11 >> 2);
      p_02->nSize = iVar4;
      if (p_02->nCap < iVar4) {
        __assert_fail("vArr->nSize <= vArr->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x6ec,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar4 < pVVar9->nSize) {
        __assert_fail("vArr->nSize >= vArr1->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x6ed,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar4 < pVVar10->nSize) {
        __assert_fail("vArr->nSize >= vArr2->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x6ee,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManCreateCoSupps( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Gia_Obj_t * pObj; int i, Id;
    Vec_Wec_t * vSuppsCo = Vec_WecStart( Gia_ManCoNum(p) );
    Vec_Wec_t * vSupps = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        Vec_IntPush( Vec_WecEntry(vSupps, Id), i );
    Gia_ManForEachAnd( p, pObj, Id )
        Vec_IntTwoMerge2( Vec_WecEntry(vSupps, Gia_ObjFaninId0(pObj, Id)), 
                          Vec_WecEntry(vSupps, Gia_ObjFaninId1(pObj, Id)), 
                          Vec_WecEntry(vSupps, Id) ); 
    Gia_ManForEachCo( p, pObj, i )
        Vec_IntAppend( Vec_WecEntry(vSuppsCo, i), Vec_WecEntry(vSupps, Gia_ObjFaninId0p(p, pObj)) );
    Vec_WecFree( vSupps );
    if ( fVerbose )
        Abc_PrintTime( 1, "Support computation", Abc_Clock() - clk );
    return vSuppsCo;
}